

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausProcessClauses(Clu_Man_t *p,int fRefs)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Fra_Sml_t *pSeq;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  int iVar10;
  Aig_Man_t *pAVar11;
  Clu_Man_t *pCVar12;
  Aig_MmFixed_t *pAVar13;
  Dar_Cut_t *pDVar14;
  timespec ts_7;
  int Scores [16];
  timespec local_a8;
  void *local_98;
  long local_90;
  timespec local_88 [4];
  Fra_Sml_t *local_48;
  Aig_MmFixed_t *local_40;
  long local_38;
  
  iVar2 = clock_gettime(3,local_88);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88[0].tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_88[0].tv_sec * -1000000;
  }
  Aig_ManRandom(1);
  pAVar11 = p->pAig;
  pSeq = Fra_SmlSimulateSeq(pAVar11,0,p->nPref + p->nSimFrames,p->nSimWords / p->nSimFrames,1);
  if ((p->fTarget == 0) || (pSeq->fNonConstOut == 0)) {
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar11,"%s =","Sim-seq");
      iVar10 = 3;
      iVar2 = clock_gettime(3,local_88);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_88[0].tv_nsec / 1000 + local_88[0].tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
    }
    iVar2 = clock_gettime(3,local_88);
    if (iVar2 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88[0].tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_88[0].tv_sec * -1000000;
    }
    if ((fRefs != 0) && (pCVar12 = p, Fra_ClausCollectLatchClauses(p,pSeq), p->fVerbose != 0)) {
      Abc_Print((int)pCVar12,"%s =","Lat-cla");
      iVar10 = 3;
      iVar2 = clock_gettime(3,local_88);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_88[0].tv_nsec / 1000 + local_88[0].tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
    }
    iVar2 = clock_gettime(3,local_88);
    if (iVar2 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88[0].tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_88[0].tv_sec * -1000000;
    }
    pAVar11 = p->pAig;
    local_40 = Dar_ManComputeCuts(pAVar11,10,0,1);
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar11,"%s =","Cuts   ");
      iVar10 = 3;
      iVar2 = clock_gettime(3,local_88);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_88[0].tv_nsec / 1000 + local_88[0].tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
    }
    pCVar12 = (Clu_Man_t *)0x3;
    iVar2 = clock_gettime(3,local_88);
    iVar10 = (int)pCVar12;
    if (iVar2 < 0) {
      local_98 = (void *)0x1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88[0].tv_nsec),8);
      local_98 = (void *)(((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_88[0].tv_sec * -1000000);
    }
    pVVar4 = p->pAig->vObjs;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        pvVar9 = pVVar4->pArray[lVar5];
        if (((pvVar9 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar9 + 0x18) & 7) - 7)) &&
           (0xffffffffffffff < *(ulong *)((long)pvVar9 + 0x18))) {
          pDVar14 = *(Dar_Cut_t **)((long)pvVar9 + 0x28);
          uVar7 = 0;
          do {
            if (0x3fffffff < *(uint *)&pDVar14->field_0x4 &&
                (*(uint *)&pDVar14->field_0x4 >> 0x1c & 1) != 0) {
              pCVar12 = p;
              iVar2 = Fra_ClausProcessClausesCut(p,pSeq,pDVar14,(int *)local_88);
              *(short *)&pDVar14->field_0x4 = (short)iVar2;
            }
            uVar7 = uVar7 + 1;
            pDVar14 = pDVar14 + 1;
          } while (uVar7 < *(byte *)((long)pvVar9 + 0x1f));
        }
        iVar10 = (int)pCVar12;
        lVar5 = lVar5 + 1;
        pVVar4 = p->pAig->vObjs;
      } while (lVar5 < pVVar4->nSize);
    }
    if (p->fVerbose != 0) {
      Abc_Print(iVar10,"%s =","Infoseq");
      iVar10 = 3;
      iVar2 = clock_gettime(3,&local_a8);
      if (iVar2 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar5 + (long)local_98) / 1000000.0);
    }
    Fra_SmlStop(pSeq);
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_a8.tv_sec * -1000000;
    }
    Aig_ManRandom(1);
    pAVar11 = p->pAig;
    local_48 = Fra_SmlSimulateComb(pAVar11,p->nSimWordsPref + p->nSimWords,0);
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar11,"%s =","Sim-cmb");
      iVar10 = 3;
      iVar2 = clock_gettime(3,&local_a8);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
    }
    iVar2 = clock_gettime(3,&local_a8);
    if (iVar2 < 0) {
      local_90 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      local_90 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_a8.tv_sec * -1000000;
    }
    pVVar4 = p->pAig->vObjs;
    if (pVVar4->nSize < 1) {
      uVar7 = 0;
    }
    else {
      lVar5 = 0;
      uVar7 = 0;
      do {
        pvVar9 = pVVar4->pArray[lVar5];
        local_38 = lVar5;
        if (((pvVar9 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar9 + 0x18) & 7) - 7)) &&
           (0xffffffffffffff < *(ulong *)((long)pvVar9 + 0x18))) {
          pDVar14 = *(Dar_Cut_t **)((long)pvVar9 + 0x28);
          uVar8 = 0;
          local_98 = pvVar9;
          do {
            if (0x3fffffff < *(uint *)&pDVar14->field_0x4 &&
                (*(uint *)&pDVar14->field_0x4 >> 0x1c & 1) != 0) {
              uVar7 = uVar7 + 1;
              uVar3 = Fra_ClausProcessClausesCut(p,local_48,pDVar14,(int *)local_88);
              uVar1 = *(uint *)&pDVar14->field_0x4;
              *(uint *)&pDVar14->field_0x4 = uVar1 & 0xffff0000;
              uVar3 = (~uVar1 | 0xffff0000) & uVar3;
              pvVar9 = local_98;
              if (uVar3 != 0) {
                lVar5 = 0;
                do {
                  if ((uVar3 >> ((uint)lVar5 & 0x1f) & 1) != 0) {
                    Fra_ClausRecordClause
                              (p,pDVar14,(uint)lVar5,*(int *)((long)&local_88[0].tv_sec + lVar5 * 4)
                              );
                  }
                  lVar5 = lVar5 + 1;
                  pvVar9 = local_98;
                } while ((uint)lVar5 >> (byte)((uint)*(undefined4 *)&pDVar14->field_0x4 >> 0x1d) ==
                         0);
              }
            }
            uVar8 = uVar8 + 1;
            pDVar14 = pDVar14 + 1;
          } while (uVar8 < *(byte *)((long)pvVar9 + 0x1f));
        }
        lVar5 = local_38 + 1;
        pVVar4 = p->pAig->vObjs;
      } while (lVar5 < pVVar4->nSize);
    }
    Fra_SmlStop(local_48);
    pAVar13 = local_40;
    Aig_MmFixedStop(local_40,0);
    if (p->fVerbose != 0) {
      Abc_Print((int)pAVar13,"%s =","Infocmb");
      iVar10 = 3;
      iVar2 = clock_gettime(3,&local_a8);
      if (iVar2 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar5 + local_90) / 1000000.0);
    }
    if (p->fVerbose != 0) {
      printf("Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n",
             (double)p->vClauses->nSize / (double)(int)uVar7,
             (ulong)(uint)(p->pAig->nObjs[6] + p->pAig->nObjs[5]),(ulong)uVar7);
    }
    iVar2 = p->vClauses->nSize;
    if (p->nClausesMax < iVar2) {
      Fra_ClausSelectClauses(p);
    }
    else {
      p->nClauses = iVar2;
    }
    iVar2 = 1;
  }
  else {
    puts("Property failed after sequential simulation!");
    Fra_SmlStop(pSeq);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Fra_ClausProcessClauses( Clu_Man_t * p, int fRefs )
{
    Aig_MmFixed_t * pMemCuts;
//    Aig_ManCut_t * pManCut;
    Fra_Sml_t * pComb, * pSeq;
    Aig_Obj_t * pObj;
    Dar_Cut_t * pCut;
    int Scores[16], uScores, i, k, j, nCuts = 0;
    abctime clk;

    // simulate the AIG
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pSeq = Fra_SmlSimulateSeq( p->pAig, 0, p->nPref + p->nSimFrames, p->nSimWords/p->nSimFrames, 1 );
    if ( p->fTarget && pSeq->fNonConstOut )
    {
        printf( "Property failed after sequential simulation!\n" );
        Fra_SmlStop( pSeq );
        return 0;
    }
if ( p->fVerbose )
{
ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}


clk = Abc_Clock();
    if ( fRefs )
    {
    Fra_ClausCollectLatchClauses( p, pSeq );
if ( p->fVerbose )
{
ABC_PRT( "Lat-cla", Abc_Clock() - clk );
}
    }


    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( p->pAig, 10, 0, 1 );
//    pManCut = Aig_ComputeCuts( p->pAig, 10, 4, 0, 1 );
if ( p->fVerbose )
{
ABC_PRT( "Cuts   ", Abc_Clock() - clk );
}

    // collect sequential info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                pCut->uTruth = Fra_ClausProcessClausesCut( p, pSeq, pCut, Scores );
//                uScores = Fra_ClausProcessClausesCut2( p, pSeq, pCut, Scores );
//                if ( uScores != pCut->uTruth )
//                {
//                    int x = 0;
//                }
            }
if ( p->fVerbose )
{
ABC_PRT( "Infoseq", Abc_Clock() - clk );
}
    Fra_SmlStop( pSeq );

    // perform combinational simulation
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, p->nSimWords + p->nSimWordsPref, 0 );
if ( p->fVerbose )
{
ABC_PRT( "Sim-cmb", Abc_Clock() - clk );
}

    // collect combinational info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                nCuts++;
                uScores = Fra_ClausProcessClausesCut( p, pComb, pCut, Scores );
                uScores &= ~pCut->uTruth; pCut->uTruth = 0;
                if ( uScores == 0 )
                    continue;
                // write the clauses
                for ( j = 0; j < (1<<pCut->nLeaves); j++ )
                    if ( uScores & (1 << j) )
                        Fra_ClausRecordClause( p, pCut, j, Scores[j] );

            }
    Fra_SmlStop( pComb );
    Aig_MmFixedStop( pMemCuts, 0 );
//    Aig_ManCutStop( pManCut );
if ( p->fVerbose )
{
ABC_PRT( "Infocmb", Abc_Clock() - clk );
}

    if ( p->fVerbose )
    printf( "Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n", 
        Aig_ManNodeNum(p->pAig), nCuts, Vec_IntSize(p->vClauses), 1.0*Vec_IntSize(p->vClauses)/nCuts );

    if ( Vec_IntSize(p->vClauses) > p->nClausesMax )
        Fra_ClausSelectClauses( p );
    else
        p->nClauses = Vec_IntSize( p->vClauses );
    return 1;
}